

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.h
# Opt level: O1

void __thiscall
ConfigManager::
Reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~Reader
          (Reader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  ~Reader(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

~Reader()
        {
            delete m_config_behavior;
        }